

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

int raviX_bitset_intersect_p(BitSet *bm1,BitSet *bm2)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = bm2->els_num;
  if (bm1->els_num < bm2->els_num) {
    uVar1 = bm1->els_num;
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if ((bm1->varr[uVar2] & bm2->varr[uVar2]) != 0) {
        return 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return 0;
}

Assistant:

int raviX_bitset_intersect_p(const BitSet * bm1, const BitSet * bm2) {
	size_t i, min_len, bm1_len = bm1->els_num;
	size_t bm2_len = bm2->els_num;
	bitset_el_t *addr1 = bm1->varr;
	bitset_el_t *addr2 = bm2->varr;

	min_len = bm1_len <= bm2_len ? bm1_len : bm2_len;
	for (i = 0; i < min_len; i++)
		if ((addr1[i] & addr2[i]) != 0) return true;
	return false;
}